

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

uint __thiscall jpgd::jpeg_decoder::get_bits_no_markers(jpeg_decoder *this,int num_bits)

{
  int iVar1;
  uint8 *puVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint uVar5;
  uint uVar6;
  
  if (num_bits == 0) {
    return 0;
  }
  if (0x10 < num_bits) {
    __assert_fail("num_bits <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x1ea,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
  }
  uVar5 = this->m_bit_buf;
  uVar6 = uVar5 >> (-(byte)num_bits & 0x1f);
  iVar1 = this->m_bits_left;
  this->m_bits_left = iVar1 - num_bits;
  if (iVar1 - num_bits != 0 && num_bits <= iVar1) {
    this->m_bit_buf = uVar5 << ((byte)num_bits & 0x1f);
    return uVar6;
  }
  uVar5 = uVar5 << ((byte)iVar1 & 0x1f);
  this->m_bit_buf = uVar5;
  if (1 < this->m_in_buf_left) {
    puVar2 = this->m_pIn_buf_ofs;
    if ((*puVar2 != 0xff) && (puVar2[1] != 0xff)) {
      this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
      this->m_in_buf_left = this->m_in_buf_left + -2;
      this->m_pIn_buf_ofs = puVar2 + 2;
      goto LAB_00152c55;
    }
  }
  uVar3 = get_octet(this);
  uVar4 = get_octet(this);
  this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
LAB_00152c55:
  iVar1 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar1 & 0x1fU);
  this->m_bits_left = iVar1 + 0x10;
  if (-0x11 < iVar1) {
    return uVar6;
  }
  __assert_fail("m_bits_left >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
}

Assistant:

inline uint jpeg_decoder::get_bits_no_markers(int num_bits)
	{
		if (!num_bits)
			return 0;

		assert(num_bits <= 16);

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			if ((m_in_buf_left < 2) || (m_pIn_buf_ofs[0] == 0xFF) || (m_pIn_buf_ofs[1] == 0xFF))
			{
				uint c1 = get_octet();
				uint c2 = get_octet();
				m_bit_buf |= (c1 << 8) | c2;
			}
			else
			{
				m_bit_buf |= ((uint)m_pIn_buf_ofs[0] << 8) | m_pIn_buf_ofs[1];
				m_in_buf_left -= 2;
				m_pIn_buf_ofs += 2;
			}

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}